

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

uint absl::anon_unknown_0::hex_digit_to_int(char c)

{
  bool bVar1;
  uint local_10;
  uint x;
  char c_local;
  
  bVar1 = ascii_isxdigit(c);
  if (!bVar1) {
    __assert_fail("absl::ascii_isxdigit(static_cast<unsigned char>(c))",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/escaping.cc"
                  ,0x33,"unsigned int absl::(anonymous namespace)::hex_digit_to_int(char)");
  }
  local_10 = (uint)(byte)c;
  if (0x39 < local_10) {
    local_10 = local_10 + 9;
  }
  return local_10 & 0xf;
}

Assistant:

inline unsigned int hex_digit_to_int(char c) {
  static_assert('0' == 0x30 && 'A' == 0x41 && 'a' == 0x61,
                "Character set must be ASCII.");
  assert(absl::ascii_isxdigit(static_cast<unsigned char>(c)));
  unsigned int x = static_cast<unsigned char>(c);
  if (x > '9') {
    x += 9;
  }
  return x & 0xf;
}